

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLDOJISTAR_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000248;
  double *in_stack_00000250;
  double *in_stack_00000258;
  double *in_stack_00000260;
  int in_stack_0000026c;
  int in_stack_00000270;
  int *in_stack_00000280;
  int *in_stack_00000288;
  int *in_stack_00000290;
  
  TVar1 = TA_CDLDOJISTAR(in_stack_00000270,in_stack_0000026c,in_stack_00000260,in_stack_00000258,
                         in_stack_00000250,in_stack_00000248,in_stack_00000280,in_stack_00000288,
                         in_stack_00000290);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLDOJISTAR_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLDOJISTAR(
/* Generated */                     startIdx,
/* Generated */                     endIdx,
/* Generated */                     params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                     params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                     params->in[0].data.inPrice.low, /* inLow */
/* Generated */                     params->in[0].data.inPrice.close, /* inClose */
/* Generated */                     outBegIdx, 
/* Generated */                     outNBElement, 
/* Generated */                     params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }